

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Abc_Cex_t * Saig_RefManReason2Cex(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  int iFrame;
  int iInput;
  int Entry;
  int i;
  Abc_Cex_t *pCare;
  Vec_Int_t *vReasons_local;
  Saig_RefMan_t *p_local;
  
  pAVar3 = Abc_CexDup(p->pCex,p->pCex->nRegs);
  iVar1 = Abc_BitWordNum(pAVar3->nBits);
  memset(pAVar3 + 1,0,(long)iVar1 << 2);
  iInput = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vReasons);
    if (iVar1 <= iInput) {
      return pAVar3;
    }
    iVar1 = Vec_IntEntry(vReasons,iInput);
    if ((iVar1 < 0) || (iVar2 = Aig_ManCiNum(p->pFrames), iVar2 <= iVar1)) break;
    iVar2 = Vec_IntEntry(p->vMapPiF2A,iVar1 << 1);
    iVar1 = Vec_IntEntry(p->vMapPiF2A,iVar1 * 2 + 1);
    Abc_InfoSetBit((uint *)(pAVar3 + 1),pAVar3->nRegs + pAVar3->nPis * iVar1 + iVar2);
    iInput = iInput + 1;
  }
  __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                ,0x65,"Abc_Cex_t *Saig_RefManReason2Cex(Saig_RefMan_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Saig_RefManReason2Cex( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Abc_Cex_t * pCare;
    int i, Entry, iInput, iFrame;
    pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
    memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*Entry+1 );
        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
    }
    return pCare;
}